

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O0

Expression * __thiscall
soul::ResolutionPass::ConstantFolder::convertExpressionListToConstant
          (ConstantFolder *this,Expression *expr,Type *targetType,CommaSeparatedList *list)

{
  Allocator *pAVar1;
  uint64_t this_00;
  bool bVar2;
  uint uVar3;
  size_t sVar4;
  Structure *numberAvailable;
  pool_ref *this_01;
  CommaSeparatedList *list_00;
  Constant *pCVar5;
  pool_ref<soul::AST::Expression> *ppVar6;
  Expression *pEVar7;
  Constant *pCVar8;
  Type *pTVar9;
  undefined8 extraout_RDX;
  complex<float> v;
  Value *in_R8;
  float __r;
  float __i;
  double __r_00;
  double __i_00;
  complex<double> v_00;
  ArrayView<soul::Value> members;
  ArrayView<soul::Value> elements;
  ArrayView<soul::Value> elements_00;
  Value local_8d8;
  pool_ptr<soul::AST::Constant> local_898;
  pool_ptr<soul::AST::Constant> constant_4;
  complex<double> local_858;
  complex<float> local_848;
  undefined1 local_840 [8];
  Value value;
  Value imagValue;
  Value realValue;
  Type attributeType;
  pool_ptr<soul::AST::Constant> imag;
  pool_ptr<soul::AST::Constant> real;
  ArrayView<soul::Value> local_720;
  undefined1 local_710 [88];
  ArrayView<soul::Value> local_6b8;
  undefined1 local_6a8 [88];
  Value local_650;
  pool_ptr<soul::AST::Constant> local_610;
  pool_ptr<soul::AST::Constant> constant_3;
  pool_ptr<soul::AST::Constant> local_5c8;
  pool_ptr<soul::AST::Constant> constant_2;
  Expression *e;
  pool_ptr<soul::AST::CommaSeparatedList> local_5b0;
  pool_ptr<soul::AST::CommaSeparatedList> itemList;
  size_t i_1;
  ArrayWithPreallocation<soul::Value,_8UL> elementValues;
  Type elementType;
  pool_ptr<soul::AST::Constant> local_330;
  pool_ptr<soul::AST::Constant> constant_1;
  Value *local_320;
  Value local_318;
  int local_2d4;
  Value local_2d0;
  pool_ptr<soul::AST::Constant> local_290;
  pool_ptr<soul::AST::Constant> constant;
  Type memberType;
  size_t i;
  undefined1 local_258 [8];
  ArrayWithPreallocation<soul::Value,_8UL> memberValues;
  Structure *s;
  ArraySize numArgs;
  CommaSeparatedList *list_local;
  Type *targetType_local;
  Expression *expr_local;
  ConstantFolder *this_local;
  
  sVar4 = ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::size(&list->items);
  numberAvailable =
       (Structure *)
       TypeRules::checkArraySizeAndThrowErrorIfIllegal<soul::AST::Context&,unsigned_long>
                 (&(expr->super_Statement).super_ASTObject.context,sVar4);
  bVar2 = Type::isStruct(targetType);
  if (bVar2) {
    SanityCheckPass::throwErrorIfWrongNumberOfElements
              (&(expr->super_Statement).super_ASTObject.context,targetType,(size_t)numberAvailable);
    memberValues.space[0x3f] = (uint64_t)Type::getStructRef(targetType);
    ArrayWithPreallocation<soul::Value,_8UL>::ArrayWithPreallocation
              ((ArrayWithPreallocation<soul::Value,_8UL> *)local_258);
    sVar4 = Structure::getNumMembers((Structure *)memberValues.space[0x3f]);
    ArrayWithPreallocation<soul::Value,_8UL>::reserve
              ((ArrayWithPreallocation<soul::Value,_8UL> *)local_258,sVar4);
    for (memberType.structure.object = (Structure *)0x0; this_00 = memberValues.space[0x3f],
        memberType.structure.object < numberAvailable;
        memberType.structure.object =
             (Structure *)
             ((long)&((memberType.structure.object)->super_RefCountedObject).refCount + 1)) {
      pTVar9 = Structure::getMemberType
                         ((Structure *)memberValues.space[0x3f],(size_t)memberType.structure.object)
      ;
      Type::Type((Type *)&constant,pTVar9);
      ppVar6 = ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::operator[]
                         (&list->items,(size_t)memberType.structure.object);
      pEVar7 = pool_ref<soul::AST::Expression>::operator->(ppVar6);
      (*(pEVar7->super_Statement).super_ASTObject._vptr_ASTObject[0xd])(&local_290);
      bVar2 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_290);
      if (bVar2) {
        pCVar8 = pool_ptr<soul::AST::Constant>::operator->(&local_290);
        uVar3 = (*(pCVar8->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject[0x10])
                          (pCVar8,&constant);
        if ((uVar3 & 1) == 0) {
          if (((this->super_ErrorIgnoringRewritingASTVisitor).ignoreErrors & 1U) == 0) {
            pCVar8 = pool_ptr<soul::AST::Constant>::operator->(&local_290);
            pCVar5 = pool_ptr<soul::AST::Constant>::operator*(&local_290);
            SanityCheckPass::expectSilentCastPossible
                      (&(pCVar8->super_Expression).super_Statement.super_ASTObject.context,
                       (Type *)&constant,&pCVar5->super_Expression);
          }
          goto LAB_003cee7f;
        }
        pCVar8 = pool_ptr<soul::AST::Constant>::operator->(&local_290);
        soul::Value::castToTypeExpectingSuccess(&local_2d0,&pCVar8->value,(Type *)&constant);
        ArrayWithPreallocation<soul::Value,_8UL>::push_back
                  ((ArrayWithPreallocation<soul::Value,_8UL> *)local_258,&local_2d0);
        soul::Value::~Value(&local_2d0);
        local_2d4 = 4;
      }
      else {
LAB_003cee7f:
        local_2d4 = 0;
      }
      pool_ptr<soul::AST::Constant>::~pool_ptr(&local_290);
      if (local_2d4 == 0) {
        local_2d4 = 1;
        this_local = (ConstantFolder *)expr;
      }
      Type::~Type((Type *)&constant);
      if (local_2d4 != 4) goto LAB_003cefd1;
    }
    pAVar1 = (this->super_ErrorIgnoringRewritingASTVisitor).allocator;
    ArrayView<soul::Value>::ArrayView<soul::ArrayWithPreallocation<soul::Value,8ul>>
              ((ArrayView<soul::Value> *)&constant_1,
               (ArrayWithPreallocation<soul::Value,_8UL> *)local_258);
    members.e = in_R8;
    members.s = local_320;
    soul::Value::createStruct(&local_318,(Value *)this_00,(Structure *)constant_1.object,members);
    this_local = (ConstantFolder *)
                 AST::Allocator::allocate<soul::AST::Constant,soul::AST::Context&,soul::Value>
                           (pAVar1,&(expr->super_Statement).super_ASTObject.context,&local_318);
    soul::Value::~Value(&local_318);
    local_2d4 = 1;
LAB_003cefd1:
    ArrayWithPreallocation<soul::Value,_8UL>::~ArrayWithPreallocation
              ((ArrayWithPreallocation<soul::Value,_8UL> *)local_258);
    return (Expression *)this_local;
  }
  bVar2 = Type::isArrayOrVector(targetType);
  if (bVar2) {
    if (numberAvailable != (Structure *)0x1) {
      SanityCheckPass::throwErrorIfWrongNumberOfElements
                (&(expr->super_Statement).super_ASTObject.context,targetType,(size_t)numberAvailable
                );
      Type::getElementType((Type *)(elementValues.space + 0x3f),targetType);
      ArrayWithPreallocation<soul::Value,_8UL>::ArrayWithPreallocation
                ((ArrayWithPreallocation<soul::Value,_8UL> *)&i_1);
      ArrayWithPreallocation<soul::Value,_8UL>::reserve
                ((ArrayWithPreallocation<soul::Value,_8UL> *)&i_1,(size_t)numberAvailable);
      for (itemList.object = (CommaSeparatedList *)0x0; itemList.object < numberAvailable;
          itemList.object =
               (CommaSeparatedList *)
               ((long)&((itemList.object)->super_Expression).super_Statement.super_ASTObject.
                       _vptr_ASTObject + 1)) {
        ppVar6 = ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::operator[]
                           (&list->items,(size_t)itemList.object);
        e = ppVar6->object;
        cast<soul::AST::CommaSeparatedList,soul::AST::Expression>
                  ((soul *)&local_5b0,(pool_ref<soul::AST::Expression> *)&e);
        pool_ref<soul::AST::Expression>::~pool_ref((pool_ref<soul::AST::Expression> *)&e);
        bVar2 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_5b0);
        if (bVar2) {
          this_01 = (pool_ref *)
                    ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::operator[]
                              (&list->items,(size_t)itemList.object);
          pEVar7 = pool_ref::operator_cast_to_Expression_(this_01);
          list_00 = pool_ptr<soul::AST::CommaSeparatedList>::operator*(&local_5b0);
          constant_2.object =
               (Constant *)
               convertExpressionListToConstant
                         (this,pEVar7,(Type *)(elementValues.space + 0x3f),list_00);
          cast<soul::AST::Constant,soul::AST::Expression>
                    ((soul *)&local_5c8,(Expression *)constant_2.object);
          bVar2 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_5c8);
          if (bVar2) {
            pCVar8 = pool_ptr<soul::AST::Constant>::operator->(&local_5c8);
            soul::Value::castToTypeExpectingSuccess
                      ((Value *)&constant_3,&pCVar8->value,(Type *)(elementValues.space + 0x3f));
            ArrayWithPreallocation<soul::Value,_8UL>::push_back
                      ((ArrayWithPreallocation<soul::Value,_8UL> *)&i_1,(Value *)&constant_3);
            soul::Value::~Value((Value *)&constant_3);
            local_2d4 = 7;
          }
          else {
            local_2d4 = 0;
          }
          pool_ptr<soul::AST::Constant>::~pool_ptr(&local_5c8);
          if (local_2d4 == 0) goto LAB_003cf41c;
        }
        else {
LAB_003cf41c:
          local_2d4 = 0;
        }
        pool_ptr<soul::AST::CommaSeparatedList>::~pool_ptr(&local_5b0);
        if (local_2d4 == 0) {
          ppVar6 = ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::operator[]
                             (&list->items,(size_t)itemList.object);
          pEVar7 = pool_ref<soul::AST::Expression>::operator->(ppVar6);
          (*(pEVar7->super_Statement).super_ASTObject._vptr_ASTObject[0xd])(&local_610);
          bVar2 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_610);
          if (bVar2) {
            pCVar8 = pool_ptr<soul::AST::Constant>::operator->(&local_610);
            pTVar9 = soul::Value::getType(&pCVar8->value);
            bVar2 = TypeRules::canCastTo((Type *)(elementValues.space + 0x3f),pTVar9);
            if (!bVar2) goto LAB_003cf58a;
            pCVar8 = pool_ptr<soul::AST::Constant>::operator->(&local_610);
            soul::Value::castToTypeExpectingSuccess
                      (&local_650,&pCVar8->value,(Type *)(elementValues.space + 0x3f));
            ArrayWithPreallocation<soul::Value,_8UL>::push_back
                      ((ArrayWithPreallocation<soul::Value,_8UL> *)&i_1,&local_650);
            soul::Value::~Value(&local_650);
            local_2d4 = 7;
          }
          else {
LAB_003cf58a:
            local_2d4 = 0;
          }
          pool_ptr<soul::AST::Constant>::~pool_ptr(&local_610);
          this_local = (ConstantFolder *)expr;
          if (local_2d4 == 0) goto LAB_003cf823;
        }
      }
      bVar2 = Type::isUnsizedArray(targetType);
      if (bVar2) {
        pAVar1 = (this->super_ErrorIgnoringRewritingASTVisitor).allocator;
        Type::createCopyWithNewArraySize((Type *)local_6a8,targetType,(ArraySize)numberAvailable);
        ArrayView<soul::Value>::ArrayView<soul::ArrayWithPreallocation<soul::Value,8ul>>
                  (&local_6b8,(ArrayWithPreallocation<soul::Value,_8UL> *)&i_1);
        elements.e = in_R8;
        elements.s = local_6b8.e;
        soul::Value::createArrayOrVector
                  ((Value *)(local_6a8 + 0x18),(Value *)local_6a8,&(local_6b8.s)->type,elements);
        this_local = (ConstantFolder *)
                     AST::Allocator::allocate<soul::AST::Constant,soul::AST::Context&,soul::Value>
                               (pAVar1,&(expr->super_Statement).super_ASTObject.context,
                                (Value *)(local_6a8 + 0x18));
        soul::Value::~Value((Value *)(local_6a8 + 0x18));
        Type::~Type((Type *)local_6a8);
      }
      else {
        if ((Structure *)0x1 < numberAvailable) {
          SanityCheckPass::throwErrorIfWrongNumberOfElements
                    (&(expr->super_Statement).super_ASTObject.context,targetType,
                     (size_t)numberAvailable);
        }
        pAVar1 = (this->super_ErrorIgnoringRewritingASTVisitor).allocator;
        Type::Type((Type *)local_710,targetType);
        ArrayView<soul::Value>::ArrayView<soul::ArrayWithPreallocation<soul::Value,8ul>>
                  (&local_720,(ArrayWithPreallocation<soul::Value,_8UL> *)&i_1);
        elements_00.e = in_R8;
        elements_00.s = local_720.e;
        soul::Value::createArrayOrVector
                  ((Value *)(local_710 + 0x18),(Value *)local_710,&(local_720.s)->type,elements_00);
        this_local = (ConstantFolder *)
                     AST::Allocator::allocate<soul::AST::Constant,soul::AST::Context&,soul::Value>
                               (pAVar1,&(expr->super_Statement).super_ASTObject.context,
                                (Value *)(local_710 + 0x18));
        soul::Value::~Value((Value *)(local_710 + 0x18));
        Type::~Type((Type *)local_710);
      }
LAB_003cf823:
      local_2d4 = 1;
      ArrayWithPreallocation<soul::Value,_8UL>::~ArrayWithPreallocation
                ((ArrayWithPreallocation<soul::Value,_8UL> *)&i_1);
      Type::~Type((Type *)(elementValues.space + 0x3f));
      return (Expression *)this_local;
    }
    ppVar6 = ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::front(&list->items)
    ;
    pEVar7 = pool_ref<soul::AST::Expression>::operator->(ppVar6);
    (*(pEVar7->super_Statement).super_ASTObject._vptr_ASTObject[0xd])(&local_330);
    bVar2 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_330);
    if (bVar2) {
      pCVar8 = pool_ptr<soul::AST::Constant>::operator->(&local_330);
      pTVar9 = soul::Value::getType(&pCVar8->value);
      bVar2 = TypeRules::canCastTo(targetType,pTVar9);
      if (bVar2) {
        pAVar1 = (this->super_ErrorIgnoringRewritingASTVisitor).allocator;
        pCVar8 = pool_ptr<soul::AST::Constant>::operator->(&local_330);
        soul::Value::castToTypeExpectingSuccess
                  ((Value *)&elementType.structure,&pCVar8->value,targetType);
        this_local = (ConstantFolder *)
                     AST::Allocator::allocate<soul::AST::Constant,soul::AST::Context&,soul::Value>
                               (pAVar1,&(expr->super_Statement).super_ASTObject.context,
                                (Value *)&elementType.structure);
        soul::Value::~Value((Value *)&elementType.structure);
        local_2d4 = 1;
        goto LAB_003cf179;
      }
    }
    local_2d4 = 0;
LAB_003cf179:
    pool_ptr<soul::AST::Constant>::~pool_ptr(&local_330);
    if (local_2d4 == 0) {
      return expr;
    }
    return (Expression *)this_local;
  }
  bVar2 = Type::isComplex(targetType);
  if (bVar2) {
    if (numberAvailable == (Structure *)0x2) {
      ppVar6 = ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::operator[]
                         (&list->items,0);
      pEVar7 = pool_ref<soul::AST::Expression>::operator->(ppVar6);
      (*(pEVar7->super_Statement).super_ASTObject._vptr_ASTObject[0xd])(&imag);
      ppVar6 = ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::operator[]
                         (&list->items,1);
      pEVar7 = pool_ref<soul::AST::Expression>::operator->(ppVar6);
      (*(pEVar7->super_Statement).super_ASTObject._vptr_ASTObject[0xd])(&attributeType.structure);
      bVar2 = pool_ptr<soul::AST::Constant>::operator==(&imag,(void *)0x0);
      if ((bVar2) ||
         (bVar2 = pool_ptr<soul::AST::Constant>::operator==
                            ((pool_ptr<soul::AST::Constant> *)&attributeType.structure,(void *)0x0),
         bVar2)) {
        local_2d4 = 1;
        this_local = (ConstantFolder *)expr;
      }
      else {
        bVar2 = Type::isComplex32(targetType);
        Type::Type((Type *)realValue.allocatedData.allocatedData.space,bVar2 ^ float64);
        pCVar8 = pool_ptr<soul::AST::Constant>::operator->(&imag);
        pCVar5 = pool_ptr<soul::AST::Constant>::operator*(&imag);
        SanityCheckPass::expectSilentCastPossible
                  (&(pCVar8->super_Expression).super_Statement.super_ASTObject.context,
                   (Type *)realValue.allocatedData.allocatedData.space,&pCVar5->super_Expression);
        pCVar8 = pool_ptr<soul::AST::Constant>::operator->
                           ((pool_ptr<soul::AST::Constant> *)&attributeType.structure);
        pCVar5 = pool_ptr<soul::AST::Constant>::operator*
                           ((pool_ptr<soul::AST::Constant> *)&attributeType.structure);
        SanityCheckPass::expectSilentCastPossible
                  (&(pCVar8->super_Expression).super_Statement.super_ASTObject.context,
                   (Type *)realValue.allocatedData.allocatedData.space,&pCVar5->super_Expression);
        pCVar8 = pool_ptr<soul::AST::Constant>::operator->(&imag);
        soul::Value::castToTypeExpectingSuccess
                  ((Value *)imagValue.allocatedData.allocatedData.space,&pCVar8->value,
                   (Type *)realValue.allocatedData.allocatedData.space);
        pCVar8 = pool_ptr<soul::AST::Constant>::operator->
                           ((pool_ptr<soul::AST::Constant> *)&attributeType.structure);
        v._M_value = (_ComplexT)&pCVar8->value;
        soul::Value::castToTypeExpectingSuccess
                  ((Value *)value.allocatedData.allocatedData.space,(Value *)v._M_value,
                   (Type *)realValue.allocatedData.allocatedData.space);
        bVar2 = Type::isComplex32(targetType);
        if (bVar2) {
          __r = soul::Value::getAsFloat((Value *)imagValue.allocatedData.allocatedData.space);
          __i = soul::Value::getAsFloat((Value *)value.allocatedData.allocatedData.space);
          std::complex<float>::complex(&local_848,__r,__i);
          soul::Value::Value((Value *)local_840,v);
        }
        else {
          __r_00 = soul::Value::getAsDouble((Value *)imagValue.allocatedData.allocatedData.space);
          __i_00 = soul::Value::getAsDouble((Value *)value.allocatedData.allocatedData.space);
          std::complex<double>::complex(&local_858,__r_00,__i_00);
          v_00._M_value._8_8_ = extraout_RDX;
          v_00._M_value._0_8_ = v._M_value;
          soul::Value::Value((Value *)local_840,v_00);
        }
        this_local = (ConstantFolder *)
                     AST::Allocator::allocate<soul::AST::Constant,soul::AST::Context&,soul::Value&>
                               ((this->super_ErrorIgnoringRewritingASTVisitor).allocator,
                                &(expr->super_Statement).super_ASTObject.context,(Value *)local_840)
        ;
        local_2d4 = 1;
        soul::Value::~Value((Value *)local_840);
        soul::Value::~Value((Value *)value.allocatedData.allocatedData.space);
        soul::Value::~Value((Value *)imagValue.allocatedData.allocatedData.space);
        Type::~Type((Type *)realValue.allocatedData.allocatedData.space);
      }
      pool_ptr<soul::AST::Constant>::~pool_ptr
                ((pool_ptr<soul::AST::Constant> *)&attributeType.structure);
      pool_ptr<soul::AST::Constant>::~pool_ptr(&imag);
      return (Expression *)this_local;
    }
    Errors::wrongNumberOfComplexInitialisers<>();
    AST::Context::throwError
              (&(expr->super_Statement).super_ASTObject.context,(CompileMessage *)&real,false);
  }
  if ((Structure *)0x1 < numberAvailable) {
    Errors::wrongTypeForInitialiseList<>();
    AST::Context::throwError
              (&(expr->super_Statement).super_ASTObject.context,(CompileMessage *)&constant_4,false)
    ;
  }
  ppVar6 = ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::front(&list->items);
  pEVar7 = pool_ref<soul::AST::Expression>::operator->(ppVar6);
  (*(pEVar7->super_Statement).super_ASTObject._vptr_ASTObject[0xd])(&local_898);
  bVar2 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_898);
  if (bVar2) {
    pCVar8 = pool_ptr<soul::AST::Constant>::operator->(&local_898);
    pTVar9 = soul::Value::getType(&pCVar8->value);
    bVar2 = TypeRules::canCastTo(targetType,pTVar9);
    if (bVar2) {
      pAVar1 = (this->super_ErrorIgnoringRewritingASTVisitor).allocator;
      pCVar8 = pool_ptr<soul::AST::Constant>::operator->(&local_898);
      soul::Value::castToTypeExpectingSuccess(&local_8d8,&pCVar8->value,targetType);
      this_local = (ConstantFolder *)
                   AST::Allocator::allocate<soul::AST::Constant,soul::AST::Context&,soul::Value>
                             (pAVar1,&(expr->super_Statement).super_ASTObject.context,&local_8d8);
      soul::Value::~Value(&local_8d8);
      local_2d4 = 1;
      goto LAB_003cfeb7;
    }
  }
  local_2d4 = 0;
LAB_003cfeb7:
  pool_ptr<soul::AST::Constant>::~pool_ptr(&local_898);
  pEVar7 = expr;
  if (local_2d4 != 0) {
    pEVar7 = (Expression *)this_local;
  }
  this_local = (ConstantFolder *)pEVar7;
  return (Expression *)this_local;
}

Assistant:

AST::Expression& convertExpressionListToConstant (AST::Expression& expr, soul::Type& targetType, AST::CommaSeparatedList& list) const
        {
            auto numArgs = TypeRules::checkArraySizeAndThrowErrorIfIllegal (expr.context, list.items.size());

            if (targetType.isStruct())
            {
                SanityCheckPass::throwErrorIfWrongNumberOfElements (expr.context, targetType, numArgs);

                auto& s = targetType.getStructRef();

                ArrayWithPreallocation<Value, 8> memberValues;
                memberValues.reserve (s.getNumMembers());

                for (size_t i = 0; i < numArgs; ++i)
                {
                    auto memberType = s.getMemberType (i);

                    if (auto constant = list.items[i]->getAsConstant())
                    {
                        if (constant->canSilentlyCastTo (memberType))
                        {
                            memberValues.push_back (constant->value.castToTypeExpectingSuccess (memberType));
                            continue;
                        }

                        if (! ignoreErrors)
                            SanityCheckPass::expectSilentCastPossible (constant->context, memberType, *constant);
                    }

                    return expr;
                }

                return allocator.allocate<AST::Constant> (expr.context, Value::createStruct (s, memberValues));
            }
            else if (targetType.isArrayOrVector())
            {
                if (numArgs == 1)
                {
                    if (auto constant = list.items.front()->getAsConstant())
                        if (TypeRules::canCastTo (targetType, constant->value.getType()))
                            return allocator.allocate<AST::Constant> (expr.context, constant->value.castToTypeExpectingSuccess (targetType));

                    return expr;
                }

                SanityCheckPass::throwErrorIfWrongNumberOfElements (expr.context, targetType, numArgs);

                auto elementType = targetType.getElementType();

                ArrayWithPreallocation<Value, 8> elementValues;
                elementValues.reserve (numArgs);

                for (size_t i = 0; i < numArgs; ++i)
                {
                    if (auto itemList = cast<AST::CommaSeparatedList> (list.items[i]))
                    {
                        auto& e = convertExpressionListToConstant (list.items[i], elementType, *itemList);

                        if (auto constant = cast<AST::Constant> (e))
                        {
                            elementValues.push_back (constant->value.castToTypeExpectingSuccess (elementType));
                            continue;
                        }
                    }

                    if (auto constant = list.items[i]->getAsConstant())
                    {
                        if (TypeRules::canCastTo (elementType, constant->value.getType()))
                        {
                            elementValues.push_back (constant->value.castToTypeExpectingSuccess (elementType));
                            continue;
                        }
                    }

                    return expr;
                }

                if (targetType.isUnsizedArray())
                    return allocator.allocate<AST::Constant> (expr.context, Value::createArrayOrVector (targetType.createCopyWithNewArraySize (numArgs),
                                                                                                     elementValues));

                if (numArgs > 1)
                    SanityCheckPass::throwErrorIfWrongNumberOfElements (expr.context, targetType, numArgs);

                return allocator.allocate<AST::Constant> (expr.context, Value::createArrayOrVector (targetType, elementValues));
            }
            else if (targetType.isComplex())
            {
                if (numArgs != 2)
                    expr.context.throwError (Errors::wrongNumberOfComplexInitialisers());

                auto real = list.items[0]->getAsConstant();
                auto imag = list.items[1]->getAsConstant();

                if (real == nullptr || imag == nullptr)
                    return expr;

                auto attributeType = Type (targetType.isComplex32() ? PrimitiveType::float32 : PrimitiveType::float64);

                SanityCheckPass::expectSilentCastPossible (real->context, attributeType, *real);
                SanityCheckPass::expectSilentCastPossible (imag->context, attributeType, *imag);

                auto realValue = real->value.castToTypeExpectingSuccess (attributeType);
                auto imagValue = imag->value.castToTypeExpectingSuccess (attributeType);

                auto value = targetType.isComplex32() ? Value (std::complex<float> (realValue.getAsFloat(), imagValue.getAsFloat()))
                                                      : Value (std::complex<double> (realValue.getAsDouble(), imagValue.getAsDouble()));

                return allocator.allocate<AST::Constant> (expr.context, value);
            }

            if (numArgs > 1)
                expr.context.throwError (Errors::wrongTypeForInitialiseList());

            if (auto constant = list.items.front()->getAsConstant())
                if (TypeRules::canCastTo (targetType, constant->value.getType()))
                    return allocator.allocate<AST::Constant> (expr.context, constant->value.castToTypeExpectingSuccess (targetType));

            return expr;
        }